

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DETECT_GOLD(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = detect_stuff((effect_handler_context_t_conflict *)(ulong)(uint)context->y,
                       (_func__Bool_object_ptr *)(ulong)(uint)context->x);
  if (_Var1) {
    fmt = "You detect the presence of gold!";
  }
  else {
    if (context->aware != true) goto LAB_0013e394;
    fmt = "You detect no gold.";
  }
  msg(fmt);
LAB_0013e394:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_GOLD(effect_handler_context_t *context)
{
	bool money = detect_stuff(context, tval_is_money);

	if (money) {
		msg("You detect the presence of gold!");
	} else if (context->aware) {
		msg("You detect no gold.");
	}

	context->ident = true;
	return true;
}